

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::changeEvent(QTreeView *this,QEvent *event)

{
  Type TVar1;
  QTreeViewPrivate *ev;
  QEvent *in_RSI;
  QTreeViewPrivate *in_RDI;
  QTreeViewPrivate *d;
  
  ev = d_func((QTreeView *)0x8f3fe1);
  TVar1 = QEvent::type(in_RSI);
  if ((TVar1 == StyleChange) && ((ev->customIndent & 1U) == 0)) {
    QTreeViewPrivate::updateIndentationFromStyle(in_RDI);
  }
  QFrame::changeEvent((QFrame *)in_RSI,(QEvent *)ev);
  return;
}

Assistant:

void QTreeView::changeEvent(QEvent *event)
{
    Q_D(QTreeView);
    if (event->type() == QEvent::StyleChange) {
        if (!d->customIndent) {
            // QAbstractItemView calls this method in case of a style change,
            // so update the indentation here if it wasn't set manually.
            d->updateIndentationFromStyle();
        }
    }
    QAbstractItemView::changeEvent(event);
}